

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FileDescriptorTables * __thiscall
google::protobuf::DescriptorPool::Tables::AllocateFileTables(Tables *this)

{
  FileDescriptorTables *this_00;
  FileDescriptorTables *result;
  FileDescriptorTables *local_20;
  
  this_00 = (FileDescriptorTables *)operator_new(0xf0);
  FileDescriptorTables::FileDescriptorTables(this_00);
  local_20 = this_00;
  std::
  vector<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>
  ::push_back(&this->file_tables_,&local_20);
  return local_20;
}

Assistant:

FileDescriptorTables* DescriptorPool::Tables::AllocateFileTables() {
  FileDescriptorTables* result = new FileDescriptorTables;
  file_tables_.push_back(result);
  return result;
}